

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::BinaryAggregateHeap<long,_double,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<long,_double,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          long *key,double *value)

{
  ulong uVar1;
  idx_t iVar2;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *__last;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<double>_> *__first;
  
  __first = this->heap;
  uVar1 = this->size;
  if (uVar1 < this->capacity) {
    __first[uVar1].first.value = *key;
    __first[uVar1].second.value = *value;
    this->size = uVar1 + 1;
    __last = __first + uVar1 + 1;
  }
  else {
    if ((__first->first).value <= *key) {
      return;
    }
    ::std::
    pop_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&)>
              (__first,__first + uVar1,Compare);
    __first = this->heap;
    iVar2 = this->size;
    __last = __first + iVar2;
    __first[iVar2 - 1].first.value = *key;
    __first[iVar2 - 1].second.value = *value;
  }
  ::std::
  push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<double>>const&)>
            (__first,__last,Compare);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}